

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm.c
# Opt level: O0

int asm_snap_checkrename(ASMState *as,IRRef ren)

{
  uint uVar1;
  ushort *puVar2;
  uint in_ESI;
  long in_RDI;
  IRIns *ir;
  IRRef ref;
  SnapEntry sn;
  MSize nent;
  MSize n;
  SnapEntry *map;
  SnapShot *snap;
  IRIns *in_stack_ffffffffffffffb8;
  uint local_2c;
  
  puVar2 = (ushort *)
           (*(long *)(*(long *)(in_RDI + 0xf8) + 0x20) + (ulong)*(uint *)(in_RDI + 0xdc) * 8);
  local_2c = 0;
  while( true ) {
    if ((byte)puVar2[3] <= local_2c) {
      return 0;
    }
    uVar1 = *(uint *)(*(long *)(*(long *)(in_RDI + 0xf8) + 0x28) + (ulong)*puVar2 * 4 +
                     (ulong)local_2c * 4) & 0xffff;
    if (uVar1 == in_ESI) break;
    local_2c = local_2c + 1;
  }
  ra_spill((ASMState *)(*(long *)(in_RDI + 0x90) + (ulong)uVar1 * 8),in_stack_ffffffffffffffb8);
  return 1;
}

Assistant:

static int asm_snap_checkrename(ASMState *as, IRRef ren)
{
  SnapShot *snap = &as->T->snap[as->snapno];
  SnapEntry *map = &as->T->snapmap[snap->mapofs];
  MSize n, nent = snap->nent;
  for (n = 0; n < nent; n++) {
    SnapEntry sn = map[n];
    IRRef ref = snap_ref(sn);
    if (ref == ren || (LJ_SOFTFP && (sn & SNAP_SOFTFPNUM) && ++ref == ren)) {
      IRIns *ir = IR(ref);
      ra_spill(as, ir);  /* Register renamed, so force a spill slot. */
      RA_DBGX((as, "snaprensp $f $s", ref, ir->s));
      return 1;  /* Found. */
    }
  }
  return 0;  /* Not found. */
}